

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

RealType __thiscall OpenMD::Thermo::getTranslationalKinetic(Thermo *this)

{
  double dVar1;
  Snapshot *this_00;
  Molecule *pMVar2;
  pointer ppSVar3;
  StuntDouble *this_01;
  RealType RVar4;
  Vector3d vel;
  MoleculeIterator miter;
  double local_80;
  Vector<double,_3U> local_68;
  MoleculeIterator local_50;
  Vector<double,_3U> local_48;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasTranslationalKineticEnergy == false) {
    local_50._M_node = (_Base_ptr)0x0;
    Vector<double,_3U>::Vector(&local_68);
    pMVar2 = SimInfo::beginMolecule(this->info_,&local_50);
    local_80 = 0.0;
LAB_00157518:
    if (pMVar2 != (Molecule *)0x0) {
      ppSVar3 = (pMVar2->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar3 ==
          (pMVar2->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_01 = (StuntDouble *)0x0;
        goto LAB_0015753b;
      }
      do {
        this_01 = *ppSVar3;
LAB_0015753b:
        do {
          if (this_01 == (StuntDouble *)0x0) {
            pMVar2 = SimInfo::nextMolecule(this->info_,&local_50);
            goto LAB_00157518;
          }
          dVar1 = this_01->mass_;
          StuntDouble::getVel((Vector3d *)&local_48,this_01);
          Vector<double,_3U>::operator=(&local_68,&local_48);
          local_80 = (local_68.data_[2] * local_68.data_[2] +
                     local_68.data_[0] * local_68.data_[0] + local_68.data_[1] * local_68.data_[1])
                     * dVar1 + local_80;
          ppSVar3 = ppSVar3 + 1;
          this_01 = (StuntDouble *)0x0;
        } while (ppSVar3 ==
                 (pMVar2->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      } while( true );
    }
    Snapshot::setTranslationalKineticEnergy(this_00,(local_80 * 0.5) / 0.0004184);
  }
  RVar4 = Snapshot::getTranslationalKineticEnergy(this_00);
  return RVar4;
}

Assistant:

RealType Thermo::getTranslationalKinetic() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasTranslationalKineticEnergy) {
      SimInfo::MoleculeIterator miter;
      vector<StuntDouble*>::iterator iiter;
      Molecule* mol;
      StuntDouble* sd;
      Vector3d vel;
      RealType mass;
      RealType kinetic(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
             sd = mol->nextIntegrableObject(iiter)) {
          mass = sd->getMass();
          vel  = sd->getVel();

          kinetic +=
              mass * (vel[0] * vel[0] + vel[1] * vel[1] + vel[2] * vel[2]);
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &kinetic, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      kinetic = kinetic * 0.5 / Constants::energyConvert;

      snap->setTranslationalKineticEnergy(kinetic);
    }
    return snap->getTranslationalKineticEnergy();
  }